

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<bool>::InsertUnique
          (KeyMapBase<bool> *this,map_index_t b,KeyNode *node)

{
  TableEntryPtr TVar1;
  ulong uVar2;
  bool bVar3;
  NodeBase *pNVar4;
  TreeIterator *in_RCX;
  ulong *extraout_RDX;
  uint uVar5;
  undefined4 in_register_00000034;
  NodeBase *pNVar6;
  ulong *puVar7;
  KeyMapBase<bool> *this_00;
  NodeAndBucket NVar8;
  NodeBase aNStack_48 [2];
  ulong uStack_38;
  KeyMapBase<bool> *pKStack_30;
  
  pNVar6 = (NodeBase *)CONCAT44(in_register_00000034,b);
  this_00 = (KeyMapBase<bool> *)&stack0xffffffffffffffd8;
  uVar2 = (ulong)b;
  uVar5 = (this->super_UntypedMapBase).index_of_first_non_null_;
  if ((uVar5 == (this->super_UntypedMapBase).num_buckets_) ||
     (in_RCX = (TreeIterator *)(this->super_UntypedMapBase).table_,
     (&in_RCX->node_)[uVar5] !=
     (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      *)0x0)) {
    uVar5 = *(byte *)&node[1].super_NodeBase.next & 1;
    pNVar6 = (NodeBase *)(ulong)uVar5;
    pKStack_30 = (KeyMapBase<bool> *)0x15f7b4;
    NVar8 = FindHelper(this,SUB41(uVar5,0),(TreeIterator *)0x0);
    if (NVar8.node == (NodeBase *)0x0) {
      TVar1 = (this->super_UntypedMapBase).table_[uVar2];
      if (TVar1 == 0) {
        pKStack_30 = (KeyMapBase<bool> *)0x15f804;
        UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
        uVar5 = (this->super_UntypedMapBase).index_of_first_non_null_;
        if (uVar5 < b) {
          b = uVar5;
        }
        (this->super_UntypedMapBase).index_of_first_non_null_ = b;
        return;
      }
      if ((TVar1 & 1) == 0) {
        pKStack_30 = (KeyMapBase<bool> *)0x15f7d6;
        bVar3 = UntypedMapBase::TableEntryIsTooLong(&this->super_UntypedMapBase,b);
        if (!bVar3) {
          UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
          return;
        }
      }
      UntypedMapBase::InsertUniqueInTree
                (&this->super_UntypedMapBase,b,NodeToVariantKey,&node->super_NodeBase);
      return;
    }
    pKStack_30 = (KeyMapBase<bool> *)0x15f839;
    InsertUnique((KeyMapBase<bool> *)&stack0xffffffffffffffd8);
  }
  pKStack_30 = (KeyMapBase<bool> *)0x15f841;
  InsertUnique((KeyMapBase<bool> *)&stack0xffffffffffffffd8);
  uVar5 = (this_00->super_UntypedMapBase).num_buckets_ - 1 & *(uint *)&pNVar6->next;
  *(uint *)&pNVar6->next = uVar5;
  uStack_38 = uVar2;
  pKStack_30 = this;
  if (((ulong)extraout_RDX & 1) != 0) {
    pNVar4 = aNStack_48;
    revalidate_if_necessary();
    if (pNVar6 != pNVar4) {
      pNVar4 = EraseFromLinkedList(pNVar4,pNVar6->next);
      pNVar6->next = pNVar4;
    }
    return;
  }
  puVar7 = (ulong *)(this_00->super_UntypedMapBase).table_[uVar5];
  if (puVar7 != extraout_RDX) {
    if (((ulong)puVar7 & 1) == 0 && puVar7 != (ulong *)0x0) {
      do {
        puVar7 = (ulong *)*puVar7;
        if (puVar7 == extraout_RDX) break;
      } while (puVar7 != (ulong *)0x0);
      if (puVar7 != (ulong *)0x0) {
        return;
      }
    }
    NVar8 = FindHelper(this_00,(ViewType)((byte)extraout_RDX[1] & 1),in_RCX);
    *(map_index_t *)&pNVar6->next = NVar8.bucket;
  }
  return;
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                !TableEntryIsEmpty(index_of_first_non_null_));
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(node->key()).node == nullptr);
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, NodeToVariantKey, node);
    }
  }